

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int height;
  int width;
  int local_30;
  int local_2c;
  undefined1 local_28 [16];
  
  glfwInit();
  iVar1 = 0;
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30001);
  window = glfwCreateWindow(300,300,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    iVar1 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    glClearColor(0x3ecccccd,0x3ecccccd,0x3ecccccd,0);
    glfwGetFramebufferSize(window,&local_2c,&local_30);
    local_28 = ZEXT416((uint)((float)local_2c / (float)local_30));
    glViewport(0,0);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glFrustum((double)-(float)local_28._0_4_,SUB84((double)(float)local_28._0_4_,0),
              0xbff0000000000000,0x3ff0000000000000,0x4014000000000000,0x404e000000000000);
    glMatrixMode(0x1700);
    glLoadIdentity();
    glTranslatef(0,0,0xc1200000);
    glClear(0x4100);
    glVertexPointer(2,0x1406,0,draw_verts);
    glColorPointer(3,0x1406,0,draw_colors);
    glEnableClientState(0x8074);
    glEnableClientState(0x8076);
    glDrawArrays(4,0,3);
    glDisableClientState(0x8074);
    glDisableClientState(0x8076);
    glfwSwapBuffers(window);
    glfwDestroyWindow(window);
    glfwTerminate();
  }
  return iVar1;
}

Assistant:

int
main(int argc, char *argv[])
{
   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
   glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
   glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API);

   window = glfwCreateWindow(300, 300, argv[0], NULL, NULL);
   if (!window) {
       return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   init();
   reshape();
   draw();

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}